

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int channel_mix_2_0_to_1_0(mixed_segment *segment)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint32_t frames;
  float *out;
  float *r;
  float *l;
  uint32_t local_2c;
  float *local_28;
  float *local_20;
  float *local_18;
  
  puVar1 = (undefined8 *)segment->data;
  local_2c = 0xffffffff;
  mixed_buffer_request_read(&local_18,&local_2c,(mixed_buffer *)*puVar1);
  mixed_buffer_request_read(&local_20,&local_2c,(mixed_buffer *)puVar1[1]);
  mixed_buffer_request_write(&local_28,&local_2c,(mixed_buffer *)puVar1[0xe]);
  if ((ulong)local_2c != 0) {
    uVar2 = 0;
    do {
      local_28[uVar2] = (local_18[uVar2] + local_20[uVar2]) * 0.5;
      uVar2 = uVar2 + 1;
    } while (local_2c != uVar2);
  }
  mixed_buffer_finish_read(local_2c,(mixed_buffer *)*puVar1);
  mixed_buffer_finish_read(local_2c,(mixed_buffer *)puVar1[1]);
  mixed_buffer_finish_write(local_2c,(mixed_buffer *)puVar1[0xe]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_1_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict out;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &frames, data->out[MIXED_MONO]);
  for(uint32_t i=0; i<frames; ++i){
    out[i] = (l[i]+r[i])*0.5;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_MONO]);
  
  return 1;
}